

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O0

bool glu::contextSupports(ContextType ctxType,ApiType requiredApiType)

{
  bool bVar1;
  ContextFlags CVar2;
  Profile PVar3;
  ApiType AVar4;
  bool local_46;
  bool local_45;
  ApiType local_2c;
  deUint32 local_28;
  deUint32 local_24;
  deUint32 local_20;
  ApiType local_1c;
  byte local_15;
  ApiType local_14;
  ApiType AStack_10;
  bool forwardCompatible;
  ApiType requiredApiType_local;
  ContextType ctxType_local;
  
  local_14.m_bits = requiredApiType.m_bits;
  AStack_10 = ctxType.super_ApiType.m_bits;
  CVar2 = ContextType::getFlags((ContextType *)&stack0xfffffffffffffff0);
  CVar2 = operator&(CVar2,CONTEXT_FORWARD_COMPATIBLE);
  local_15 = CVar2 != 0;
  local_1c.m_bits = AStack_10.m_bits;
  bVar1 = isContextTypeES((ContextType)AStack_10.m_bits);
  if (bVar1) {
    PVar3 = ApiType::getProfile(&local_14);
    local_45 = false;
    if (PVar3 == PROFILE_ES) {
      local_20 = (deUint32)ContextType::getAPI((ContextType *)&stack0xfffffffffffffff0);
      local_24 = local_14.m_bits;
      local_45 = versionGreaterOrEqual((ApiType)local_20,local_14);
    }
    return local_45;
  }
  local_28 = AStack_10.m_bits;
  bVar1 = isContextTypeGLCore((ContextType)AStack_10.m_bits);
  if (bVar1) {
    if ((local_15 & 1) == 0) {
      PVar3 = ApiType::getProfile(&local_14);
      local_46 = false;
      if (PVar3 == PROFILE_CORE) {
        AVar4 = ContextType::getAPI((ContextType *)&stack0xfffffffffffffff0);
        local_46 = versionGreaterOrEqual(AVar4,local_14);
      }
      return local_46;
    }
    local_2c = ContextType::getAPI((ContextType *)&stack0xfffffffffffffff0);
    bVar1 = ApiType::operator==(&local_2c,local_14);
    return bVar1;
  }
  bVar1 = isContextTypeGLCompatibility((ContextType)AStack_10.m_bits);
  if (!bVar1) {
    return false;
  }
  PVar3 = ApiType::getProfile(&local_14);
  if ((PVar3 != PROFILE_CORE) &&
     (PVar3 = ApiType::getProfile(&local_14), PVar3 != PROFILE_COMPATIBILITY)) {
    return false;
  }
  AVar4 = ContextType::getAPI((ContextType *)&stack0xfffffffffffffff0);
  bVar1 = versionGreaterOrEqual(AVar4,local_14);
  return bVar1;
}

Assistant:

bool contextSupports (ContextType ctxType, ApiType requiredApiType)
{
	// \todo [2014-10-06 pyry] Check exact forward-compatible restrictions.
	const bool forwardCompatible = (ctxType.getFlags() & CONTEXT_FORWARD_COMPATIBLE) != 0;

	if (isContextTypeES(ctxType))
	{
		DE_ASSERT(!forwardCompatible);
		return requiredApiType.getProfile() == PROFILE_ES &&
			   versionGreaterOrEqual(ctxType.getAPI(), requiredApiType);
	}
	else if (isContextTypeGLCore(ctxType))
	{
		if (forwardCompatible)
			return ctxType.getAPI() == requiredApiType;
		else
			return requiredApiType.getProfile() == PROFILE_CORE &&
				   versionGreaterOrEqual(ctxType.getAPI(), requiredApiType);
	}
	else if (isContextTypeGLCompatibility(ctxType))
	{
		DE_ASSERT(!forwardCompatible);
		return (requiredApiType.getProfile() == PROFILE_CORE || requiredApiType.getProfile() == PROFILE_COMPATIBILITY) &&
			   versionGreaterOrEqual(ctxType.getAPI(), requiredApiType);
	}
	else
	{
		DE_ASSERT(false);
		return false;
	}
}